

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O0

MidiEventList * __thiscall smf::MidiEventList::operator=(MidiEventList *this,MidiEventList *other)

{
  MidiEventList *other_local;
  MidiEventList *this_local;
  
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::swap(&this->list,&other->list);
  return this;
}

Assistant:

MidiEventList& MidiEventList::operator=(MidiEventList& other) {
	list.swap(other.list);
	return *this;
}